

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_list_inserttail2(QcList *list,void *data,QcListEntry **pp_entry)

{
  QcListEntry *__s;
  QcListEntry *entry;
  QcListEntry **pp_entry_local;
  void *data_local;
  QcList *list_local;
  
  if (list == (QcList *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x229);
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x229,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
  }
  if (data != (void *)0x0) {
    __s = (QcListEntry *)malloc(0x18);
    if (__s == (QcListEntry *)0x0) {
      fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
              ,0x22c);
      __assert_fail("entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                    ,0x22c,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
    }
    memset(__s,0,0x18);
    if (__s == (QcListEntry *)0x0) {
      *pp_entry = (QcListEntry *)0x0;
      list_local._4_4_ = -1;
    }
    else {
      __s->data = data;
      __s->next = (QcListEntry *)0x0;
      __s->prev = list->tail;
      if (list->tail == (QcListEntry *)0x0) {
        list->head = __s;
      }
      else {
        list->tail->next = __s;
      }
      list->tail = __s;
      list->count = list->count + 1;
      *pp_entry = __s;
      list_local._4_4_ = 0;
    }
    return list_local._4_4_;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x22a);
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x22a,"int qc_list_inserttail2(QcList *, void *, QcListEntry **)");
}

Assistant:

int qc_list_inserttail2(QcList *list, void *data, QcListEntry **pp_entry)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        *pp_entry = NULL;
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    *pp_entry  = entry;
    
    return 0;
}